

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O2

void tcu::TexVerifierUtil::getPossibleCubeFaces
               (Vec3 *coord,IVec3 *bits,CubeFace *faces,int *numFaces)

{
  float value;
  float value_00;
  float value_01;
  uint uVar1;
  int iVar2;
  uint uVar3;
  CubeFace CVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  value = coord->m_data[0];
  value_00 = coord->m_data[1];
  value_01 = coord->m_data[2];
  fVar9 = -value;
  if (-value <= value) {
    fVar9 = value;
  }
  fVar10 = -value_00;
  if (-value_00 <= value_00) {
    fVar10 = value_00;
  }
  fVar8 = -value_01;
  if (-value_01 <= value_01) {
    fVar8 = value_01;
  }
  fVar5 = computeFloatingPointError(value,bits->m_data[0]);
  fVar6 = computeFloatingPointError(value_00,bits->m_data[1]);
  fVar7 = computeFloatingPointError(value_01,bits->m_data[2]);
  *numFaces = 0;
  if ((fVar9 - fVar5 <= fVar10 + fVar6) || (fVar9 - fVar5 <= fVar8 + fVar7)) {
    if ((fVar10 - fVar6 <= fVar9 + fVar5) || (fVar10 - fVar6 <= fVar8 + fVar7)) {
      if ((fVar8 - fVar7 <= fVar9 + fVar5) || (fVar8 - fVar7 <= fVar10 + fVar6)) {
        uVar1 = 0;
        if (fVar5 < fVar9) {
          *faces = CUBEFACE_NEGATIVE_X;
          *numFaces = 2;
          faces[1] = CUBEFACE_POSITIVE_X;
          uVar1 = 2;
        }
        uVar3 = uVar1;
        if (fVar6 < fVar10) {
          faces[uVar1] = CUBEFACE_NEGATIVE_Y;
          uVar3 = uVar1 + 2;
          *numFaces = uVar3;
          faces[(ulong)uVar1 + 1] = CUBEFACE_POSITIVE_Y;
        }
        if (fVar8 <= fVar7) {
          return;
        }
        uVar1 = uVar3 + 1;
        faces[uVar3] = CUBEFACE_NEGATIVE_Z;
        iVar2 = uVar3 + 2;
        CVar4 = CUBEFACE_POSITIVE_Z;
      }
      else {
        if (fVar7 <= value_01) {
          *numFaces = 1;
          *faces = CUBEFACE_POSITIVE_Z;
        }
        uVar1 = (uint)(fVar7 <= value_01);
        if (fVar7 < value_01) {
          return;
        }
        iVar2 = uVar1 + 1;
        CVar4 = CUBEFACE_NEGATIVE_Z;
      }
    }
    else {
      if (fVar6 <= value_00) {
        *numFaces = 1;
        *faces = CUBEFACE_POSITIVE_Y;
      }
      uVar1 = (uint)(fVar6 <= value_00);
      if (fVar6 < value_00) {
        return;
      }
      iVar2 = uVar1 + 1;
      CVar4 = CUBEFACE_NEGATIVE_Y;
    }
  }
  else {
    if (fVar5 <= value) {
      *numFaces = 1;
      *faces = CUBEFACE_POSITIVE_X;
    }
    uVar1 = (uint)(fVar5 <= value);
    if (fVar5 < value) {
      return;
    }
    iVar2 = uVar1 + 1;
    CVar4 = CUBEFACE_NEGATIVE_X;
  }
  *numFaces = iVar2;
  faces[uVar1] = CVar4;
  return;
}

Assistant:

void getPossibleCubeFaces (const Vec3& coord, const IVec3& bits, CubeFace* faces, int& numFaces)
{
	const float	x	= coord.x();
	const float	y	= coord.y();
	const float	z	= coord.z();
	const float ax	= de::abs(x);
	const float ay	= de::abs(y);
	const float az	= de::abs(z);
	const float ex	= computeFloatingPointError(x, bits.x());
	const float	ey	= computeFloatingPointError(y, bits.y());
	const float ez	= computeFloatingPointError(z, bits.z());

	numFaces = 0;

	if (ay+ey < ax-ex && az+ez < ax-ex)
	{
		if (x >= ex) faces[numFaces++] = CUBEFACE_POSITIVE_X;
		if (x <= ex) faces[numFaces++] = CUBEFACE_NEGATIVE_X;
	}
	else if (ax+ex < ay-ey && az+ez < ay-ey)
	{
		if (y >= ey) faces[numFaces++] = CUBEFACE_POSITIVE_Y;
		if (y <= ey) faces[numFaces++] = CUBEFACE_NEGATIVE_Y;
	}
	else if (ax+ex < az-ez && ay+ey < az-ez)
	{
		if (z >= ez) faces[numFaces++] = CUBEFACE_POSITIVE_Z;
		if (z <= ez) faces[numFaces++] = CUBEFACE_NEGATIVE_Z;
	}
	else
	{
		// One or more components are equal (or within error bounds). Allow all faces where major axis is not zero.
		if (ax > ex)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_X;
			faces[numFaces++] = CUBEFACE_POSITIVE_X;
		}

		if (ay > ey)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_Y;
			faces[numFaces++] = CUBEFACE_POSITIVE_Y;
		}

		if (az > ez)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_Z;
			faces[numFaces++] = CUBEFACE_POSITIVE_Z;
		}
	}
}